

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O3

void usage(char *command)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (command == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12c1f0);
  }
  else {
    sVar1 = strlen(command);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,command,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," input(s)",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void usage(const char* command) {
   cout << "Usage: " << command << " input(s)" << endl;
}